

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::languageItemList(GrpParser *this)

{
  int iVar1;
  ASTPair *in_RDI;
  ParserException *ex;
  RefAST languageItemList_AST;
  ASTPair currentAST;
  GrpParser *in_stack_00000310;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  RefAST *other;
  RefCount<AST> *in_stack_ffffffffffffffc0;
  RefAST *in_stack_ffffffffffffffe0;
  ASTPair *in_stack_ffffffffffffffe8;
  ASTFactory *in_stack_fffffffffffffff0;
  
  other = &nullAST;
  RefCount<AST>::operator=(in_stack_ffffffffffffffc0,&nullAST);
  ASTPair::ASTPair(in_RDI);
  RefCount<AST>::RefCount
            (&in_RDI->root,
             (RefCount<AST> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while (((iVar1 = (*(code *)(in_RDI->root).ref[2].ptr)(in_RDI,1), iVar1 == 0xd ||
          (in_stack_ffffffffffffffa8 = (*(code *)(in_RDI->root).ref[2].ptr)(in_RDI,1),
          in_stack_ffffffffffffffa8 == 0x23)) ||
         (in_stack_ffffffffffffffa4 = (*(code *)(in_RDI->root).ref[2].ptr)(in_RDI,1),
         in_stack_ffffffffffffffa4 == 0x24))) {
    languageSpecItem(in_stack_00000310);
    RefCount<AST>::RefCount
              (&in_RDI->root,(RefCount<AST> *)CONCAT44(iVar1,in_stack_ffffffffffffffa8));
    ASTFactory::addASTChild
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  RefCount<AST>::operator=(in_stack_ffffffffffffffc0,other);
  RefCount<AST>::operator=(in_stack_ffffffffffffffc0,other);
  RefCount<AST>::~RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  ASTPair::~ASTPair((ASTPair *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

void GrpParser::languageItemList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST languageItemList_AST = nullAST;
	
	try {      // for error handling
		{
		do {
			if ((LA(1)==IDENT||LA(1)==LITERAL_language||LA(1)==LITERAL_languages)) {
				languageSpecItem();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else {
				goto _loop173;
			}
			
		} while (true);
		_loop173:;
		}
		languageItemList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_46);
	}
	returnAST = languageItemList_AST;
}